

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

uint __thiscall
MovParsedSRTTrackData::newBufferSize(MovParsedSRTTrackData *this,uint8_t *buff,uint size)

{
  uint8_t *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint8_t uVar8;
  byte bVar9;
  int64_t iVar10;
  int64_t iVar11;
  long lVar12;
  int iVar13;
  int64_t iVar14;
  byte *pbVar15;
  uint16_t endChar;
  ulong uStack_118;
  uint16_t startChar;
  size_t i_1;
  int local_108;
  uint16_t entry_count;
  int i;
  uint32_t modifierType;
  int64_t modifierLen;
  int unitSize;
  int textLen;
  string local_d0;
  int local_ac;
  string local_a8;
  undefined4 local_84;
  long local_80;
  int64_t endTime;
  int64_t startTime;
  string local_60 [8];
  string prefix;
  uint8_t *end;
  int64_t stored_sttsPos;
  int64_t stored_sttsCnt;
  byte *pbStack_20;
  uint size_local;
  uint8_t *buff_local;
  MovParsedSRTTrackData *this_local;
  
  iVar10 = this->sttsCnt;
  iVar11 = this->sttsPos;
  prefix.field_2._8_8_ = buff + size;
  std::__cxx11::string::string(local_60);
  if (this->m_packetCnt == 0) {
    std::__cxx11::string::operator=(local_60,anon_var_dwarf_f633c);
  }
  lVar12 = this->m_timeOffset;
  endTime = lVar12;
  iVar14 = getSttsVal(this);
  local_80 = lVar12 + iVar14;
  if (size < 3) {
    this->m_timeOffset = local_80;
    this_local._4_4_ = 0;
  }
  else {
    local_ac = this->m_packetCnt + 1;
    int32ToStr_abi_cxx11_(&local_a8,&local_ac);
    std::__cxx11::string::operator+=(local_60,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::operator+=(local_60,"\n");
    floatToTime_abi_cxx11_(&local_d0,(double)endTime / 1000.0,',');
    std::__cxx11::string::operator+=(local_60,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::operator+=(local_60," --> ");
    floatToTime_abi_cxx11_((string *)&unitSize,(double)local_80 / 1000.0,',');
    std::__cxx11::string::operator+=(local_60,(string *)&unitSize);
    std::__cxx11::string::~string((string *)&unitSize);
    std::__cxx11::string::operator+=(local_60,'\n');
    modifierLen._0_4_ = 0;
    pbStack_20 = buff;
    while ((uint)modifierLen == 0) {
      uVar8 = *pbStack_20;
      puVar1 = pbStack_20 + 1;
      pbStack_20 = pbStack_20 + 2;
      modifierLen._0_4_ = (uint)CONCAT11(uVar8,*puVar1);
    }
    modifierLen._4_4_ = (uint)modifierLen;
    pbStack_20 = pbStack_20 + (int)(uint)modifierLen;
    while (pbStack_20 < (ulong)prefix.field_2._8_8_) {
      bVar9 = *pbStack_20;
      pbVar2 = pbStack_20 + 1;
      pbVar15 = pbStack_20 + 2;
      pbVar3 = pbStack_20 + 3;
      pbVar4 = pbStack_20 + 4;
      pbVar5 = pbStack_20 + 5;
      pbVar6 = pbStack_20 + 6;
      pbVar7 = pbStack_20 + 7;
      pbStack_20 = pbStack_20 + 8;
      _i = (long)(int)((uint)bVar9 << 0x18 | (uint)*pbVar2 << 0x10 | (uint)*pbVar15 << 8 |
                      (uint)*pbVar3) + -8;
      if (_i == 1) {
        _i = 0;
        for (local_108 = 0; local_108 < 8; local_108 = local_108 + 1) {
          _i = (ulong)*pbStack_20 | _i << 8;
          pbStack_20 = pbStack_20 + 1;
        }
        _i = _i - 8;
      }
      if (((uint)*pbVar4 << 0x18 | (uint)*pbVar5 << 0x10 | (uint)*pbVar6 << 8 | (uint)*pbVar7) ==
          0x7374796c) {
        bVar9 = *pbStack_20;
        pbVar2 = pbStack_20 + 1;
        pbStack_20 = pbStack_20 + 2;
        for (uStack_118 = 0; uStack_118 < CONCAT11(bVar9,*pbVar2); uStack_118 = uStack_118 + 1) {
          pbVar15 = pbStack_20 + 6;
          if (CONCAT11(*pbStack_20,pbStack_20[1]) < CONCAT11(pbStack_20[2],pbStack_20[3])) {
            if ((*pbVar15 & 1) != 0) {
              modifierLen._4_4_ = modifierLen._4_4_ + 7;
            }
            if ((*pbVar15 & 2) != 0) {
              modifierLen._4_4_ = modifierLen._4_4_ + 7;
            }
            if ((*pbVar15 & 4) != 0) {
              modifierLen._4_4_ = modifierLen._4_4_ + 7;
            }
          }
          pbStack_20 = pbStack_20 + 0xc;
        }
      }
      else {
        pbStack_20 = pbStack_20 + _i;
      }
    }
    this->sttsCnt = iVar10;
    this->sttsPos = iVar11;
    iVar13 = std::__cxx11::string::length();
    this_local._4_4_ = iVar13 + modifierLen._4_4_ + 2;
  }
  local_84 = 1;
  std::__cxx11::string::~string(local_60);
  return this_local._4_4_;
}

Assistant:

unsigned newBufferSize(uint8_t* buff, const unsigned size) override
    {
        const int64_t stored_sttsCnt = sttsCnt;
        const int64_t stored_sttsPos = sttsPos;
        const uint8_t* end = buff + size;
        std::string prefix;
        if (m_packetCnt == 0)
            prefix = "\xEF\xBB\xBF";  // UTF-8 header
        const int64_t startTime = m_timeOffset;
        const int64_t endTime = startTime + getSttsVal();
        if (size <= 2)
        {
            m_timeOffset = endTime;
            return 0;
        }
        prefix += int32ToStr(m_packetCnt + 1);
        prefix += "\n";
        prefix += floatToTime(static_cast<double>(startTime) / 1e3, ',');
        prefix += " --> ";
        prefix += floatToTime(static_cast<double>(endTime) / 1e3, ',');
        prefix += '\n';
        int textLen = 0, unitSize = 0;

        try
        {
            while (unitSize == 0)
            {
                unitSize = (buff[0] << 8) | buff[1];
                buff += 2;
            }
            textLen = unitSize;
            buff += unitSize;

            while (buff < end)
            {
                int64_t modifierLen = buff[0] << 24 | buff[1] << 16 | buff[2] << 8 | buff[3];
                const uint32_t modifierType = buff[4] << 24 | buff[5] << 16 | buff[6] << 8 | buff[7];
                buff += 8;
                modifierLen -= 8;
                if (modifierLen == 1)  // 64-bit length
                {
                    modifierLen = 0;
                    for (int i = 0; i < 8; i++)
                    {
                        modifierLen <<= 8;
                        modifierLen |= *buff++;
                    }
                    modifierLen -= 8;
                }
                if (modifierType == 0x7374796C)  // 'styl' box
                {
                    const auto entry_count = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                    buff += 2;
                    for (size_t i = 0; i < entry_count; i++)
                    {
                        const auto startChar = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                        const auto endChar = static_cast<uint16_t>(buff[2] << 8 | buff[3]);
                        buff += 6;                // startChar, endChar, font-ID
                        if (startChar < endChar)  // face style flags
                        {
                            if (*buff & 1)  // bold
                                textLen += 7;
                            if (*buff & 2)  // italics
                                textLen += 7;
                            if (*buff & 4)  // underline
                                textLen += 7;
                        }
                        buff += 6;  // font-size, text-color-rgba[4]
                    }
                }
                else
                    buff += modifierLen;
            }
        }
        catch (BitStreamException& e)
        {
            (void)e;
            LTRACE(LT_ERROR, 2, "MP4/MOV error: Invalid SRT frame at position " << m_demuxer->getProcessedBytes());
        }

        sttsCnt = stored_sttsCnt;
        sttsPos = stored_sttsPos;
        return static_cast<int>(prefix.length() + textLen + 2);
    }